

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsSecondPartialDerivativeWRTStateSparsity
          (OptimalControlProblem *this,SparsityStructure *stateSparsity)

{
  OptimalControlProblemPimpl *pOVar1;
  char cVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  size_t numberOfRows;
  size_t numberOfColumns;
  _Rb_tree_node_base *p_Var5;
  _Self __tmp;
  ostringstream errorMsg;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  p_Var4 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_00147450:
  if ((_Rb_tree_header *)p_Var4 != &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header)
  goto code_r0x0014745c;
  SparsityStructure::clear(&this->m_pimpl->costsStateHessianSparsity);
  pOVar1 = this->m_pimpl;
  for (p_Var5 = (pOVar1->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pOVar1->costs)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    SparsityStructure::merge
              (&this->m_pimpl->costsStateHessianSparsity,(SparsityStructure *)&p_Var5[9]._M_left);
  }
  goto LAB_00147519;
code_r0x0014745c:
  cVar2 = (**(code **)(**(long **)(p_Var4 + 2) + 0x40))();
  *(char *)&p_Var4[0x13]._M_parent = cVar2;
  p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  if (cVar2 == '\0') {
    if ((this->m_pimpl->dynamicalSystem).
        super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown."
                 ,0xa2);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("OptimalControlProblem","costsSecondPartialDerivativeWRTStateSparsity",
                 (char *)local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar3 = false;
    }
    else {
      SparsityStructure::clear(&this->m_pimpl->costsStateHessianSparsity);
      pOVar1 = this->m_pimpl;
      numberOfRows = DynamicalSystem::stateSpaceSize
                               ((pOVar1->dynamicalSystem).
                                super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
      numberOfColumns =
           DynamicalSystem::stateSpaceSize
                     ((this->m_pimpl->dynamicalSystem).
                      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
      SparsityStructure::addDenseBlock
                (&pOVar1->costsStateHessianSparsity,0,0,numberOfRows,numberOfColumns);
LAB_00147519:
      pOVar1 = this->m_pimpl;
      if (&pOVar1->costsStateHessianSparsity != stateSparsity) {
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)stateSparsity,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&pOVar1->costsStateHessianSparsity);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&stateSparsity->m_nonZeroElementRows,
                 &(pOVar1->costsStateHessianSparsity).m_nonZeroElementRows);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&stateSparsity->m_nonZeroElementColumns,
                 &(pOVar1->costsStateHessianSparsity).m_nonZeroElementColumns);
      bVar3 = true;
    }
    return bVar3;
  }
  goto LAB_00147450;
}

Assistant:

bool OptimalControlProblem::costsSecondPartialDerivativeWRTStateSparsity(SparsityStructure &stateSparsity)
        {
            bool allHaveSparsity = true;

            auto cost = m_pimpl->costs.begin();

            while (allHaveSparsity && cost != m_pimpl->costs.end()) {
                cost->second.hasStateHessianSparsity =
                    cost->second.cost->costSecondPartialDerivativeWRTStateSparsity(cost->second.stateHessianSparsity);
                allHaveSparsity &= cost->second.hasStateHessianSparsity;
                cost++;
            }

            if (allHaveSparsity) {
                m_pimpl->costsStateHessianSparsity.clear();

                for (auto& costPtr : m_pimpl->costs) {
                    m_pimpl->costsStateHessianSparsity.merge(costPtr.second.stateHessianSparsity);
                }

            } else {
                if (m_pimpl->dynamicalSystem) {
                    m_pimpl->costsStateHessianSparsity.clear();
                    m_pimpl->costsStateHessianSparsity.addDenseBlock(0, 0, m_pimpl->dynamicalSystem->stateSpaceSize(), m_pimpl->dynamicalSystem->stateSpaceSize());
                } else {
                    std::ostringstream errorMsg;
                    errorMsg << "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown.";
                    reportError("OptimalControlProblem", "costsSecondPartialDerivativeWRTStateSparsity", errorMsg.str().c_str());
                    return false;
                }
            }

            stateSparsity = m_pimpl->costsStateHessianSparsity;
            return true;
        }